

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O3

void __thiscall
flatbuffers::JsonPrinter::GenField<unsigned_int>
          (JsonPrinter *this,FieldDef *fd,Table *table,bool fixed,int indent)

{
  ushort uVar1;
  uint val;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,fixed) == 0) {
    if (fd->presence == kOptional) {
      uVar1 = (fd->value).offset;
      if ((*(ushort *)(table + -(long)*(int *)table) <= uVar1) ||
         ((ulong)*(ushort *)(table + ((ulong)uVar1 - (long)*(int *)table)) == 0)) {
        std::__cxx11::string::append((char *)this->text);
        return;
      }
      val = *(uint *)(table + *(ushort *)(table + ((ulong)uVar1 - (long)*(int *)table)));
    }
    else {
      uVar1 = (fd->value).offset;
      val = GetFieldDefault<unsigned_int>(fd);
      if ((uVar1 < *(ushort *)(table + -(long)*(int *)table)) &&
         ((ulong)*(ushort *)(table + ((ulong)uVar1 - (long)*(int *)table)) != 0)) {
        val = *(uint *)(table + *(ushort *)(table + ((ulong)uVar1 - (long)*(int *)table)));
      }
    }
  }
  else {
    val = *(uint *)(table + (fd->value).offset);
  }
  PrintScalar<unsigned_int>(this,val,&(fd->value).type,indent);
  return;
}

Assistant:

void GenField(const FieldDef &fd, const Table *table, bool fixed,
                int indent) {
    if (fixed) {
      PrintScalar(
          reinterpret_cast<const Struct *>(table)->GetField<T>(fd.value.offset),
          fd.value.type, indent);
    } else if (fd.IsOptional()) {
      auto opt = table->GetOptional<T, T>(fd.value.offset);
      if (opt) {
        PrintScalar(*opt, fd.value.type, indent);
      } else {
        text += "null";
      }
    } else {
      PrintScalar(table->GetField<T>(fd.value.offset, GetFieldDefault<T>(fd)),
                  fd.value.type, indent);
    }
  }